

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

string * __thiscall
re2c::output_yych_abi_cxx11_(string *__return_storage_ptr__,re2c *this,bool *readCh)

{
  opt_t *poVar1;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  re2c *local_18;
  bool *readCh_local;
  
  local_18 = this;
  readCh_local = (bool *)__return_storage_ptr__;
  if (((byte)*this & 1) == 0) {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&poVar1->yych);
  }
  else {
    *this = (re2c)0x0;
    poVar1 = Opt::operator->((Opt *)&opts);
    InputAPI::expr_peek_save_abi_cxx11_(&local_58,&poVar1->input_api);
    std::operator+(&local_38,"(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string output_yych (bool & readCh)
{
	if (readCh)
	{
		readCh = false;
		return "(" + opts->input_api.expr_peek_save () + ")";
	}
	else
	{
		return opts->yych;
	}
}